

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_36::WebSocketImpl::ZlibContext::~ZlibContext(ZlibContext *this)

{
  ZlibContext *this_local;
  
  if (this->mode == COMPRESS) {
    deflateEnd(&this->ctx);
  }
  else if (this->mode == DECOMPRESS) {
    inflateEnd(&this->ctx);
  }
  return;
}

Assistant:

~ZlibContext() noexcept(false) {
      switch (mode) {
        case Mode::COMPRESS:
          deflateEnd(&ctx);
          break;
        case Mode::DECOMPRESS:
          inflateEnd(&ctx);
          break;
      }
    }